

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

void Aig_SupportSize_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int *pCounter)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = p->nTravIds;
  if (pObj->TravId != iVar1) {
    while( true ) {
      pObj->TravId = iVar1;
      uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
      uVar3 = uVar2 & 7;
      if (uVar3 == 2) break;
      if ((uVar3 != 4) && (1 < (uVar2 & 7) - 5)) {
        __assert_fail("Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                      ,0x2e5,"void Aig_SupportSize_rec(Aig_Man_t *, Aig_Obj_t *, int *)");
      }
      Aig_SupportSize_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pCounter);
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      if (pObj == (Aig_Obj_t *)0x0) {
        return;
      }
      iVar1 = p->nTravIds;
      if (pObj->TravId == iVar1) {
        return;
      }
    }
    *pCounter = *pCounter + 1;
  }
  return;
}

Assistant:

void Aig_SupportSize_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int * pCounter )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        (*pCounter)++;
        return;
    }
    assert( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) );
    Aig_SupportSize_rec( p, Aig_ObjFanin0(pObj), pCounter );
    if ( Aig_ObjFanin1(pObj) )
        Aig_SupportSize_rec( p, Aig_ObjFanin1(pObj), pCounter );
}